

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O3

void __thiscall QAbstractSpinBoxPrivate::editorTextChanged(QAbstractSpinBoxPrivate *this,QString *t)

{
  long *plVar1;
  byte bVar2;
  int iVar3;
  long in_FS_OFFSET;
  QStringView QVar4;
  QStringView QVar5;
  int pos;
  QArrayData *local_60;
  char16_t *local_58;
  qsizetype local_50;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(ushort *)&this->field_0x3d0 & 0x40) == 0) {
    *(ushort *)&this->field_0x3d0 = *(ushort *)&this->field_0x3d0 | 1;
  }
  else {
    plVar1 = *(long **)&(this->super_QWidgetPrivate).field_0x8;
    local_60 = &((t->d).d)->super_QArrayData;
    local_58 = (t->d).ptr;
    local_50 = (t->d).size;
    if (local_60 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_60->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_60->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QLineEdit::cursorPosition(this->edit);
    iVar3 = (**(code **)(*plVar1 + 0x1a0))(plVar1,&local_60);
    if (iVar3 == 2) {
      local_48._16_4_ = 0xaaaaaaaa;
      local_48._20_4_ = 0xaaaaaaaa;
      uStack_30 = 0xaaaaaaaa;
      uStack_2c = 0xaaaaaaaa;
      local_48._0_4_ = 0xaaaaaaaa;
      local_48._4_4_ = 0xaaaaaaaa;
      local_48._8_4_ = 0xaaaaaaaa;
      local_48._12_4_ = 0xaaaaaaaa;
      (**(code **)(*(long *)&this->super_QWidgetPrivate + 0xe0))(&local_48,this,&local_60);
      bVar2 = true;
      if (local_50 == (t->d).size) {
        QVar4.m_data = local_58;
        QVar4.m_size = local_50;
        QVar5.m_data = (t->d).ptr;
        QVar5.m_size = local_50;
        bVar2 = QtPrivate::equalStrings(QVar4,QVar5);
        bVar2 = bVar2 ^ 1;
      }
      setValue(this,(QVariant *)&local_48,EmitIfChanged,(bool)bVar2);
      this->field_0x3d0 = this->field_0x3d0 & 0xfe;
      ::QVariant::~QVariant((QVariant *)&local_48);
    }
    else {
      this->field_0x3d0 = this->field_0x3d0 | 1;
    }
    if (local_60 != (QArrayData *)0x0) {
      LOCK();
      (local_60->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_60,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractSpinBoxPrivate::editorTextChanged(const QString &t)
{
    Q_Q(QAbstractSpinBox);

    if (keyboardTracking) {
        QString tmp = t;
        int pos = edit->cursorPosition();
        QValidator::State state = q->validate(tmp, pos);
        if (state == QValidator::Acceptable) {
            const QVariant v = valueFromText(tmp);
            setValue(v, EmitIfChanged, tmp != t);
            pendingEmit = false;
        } else {
            pendingEmit = true;
        }
    } else {
        pendingEmit = true;
    }
}